

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O3

void __thiscall amrex::ErrorRec::~ErrorRec(ErrorRec *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_ErrorRec = (_func_int **)&PTR__ErrorRec_0080d278;
  if (this->err_func != (ErrorFunc *)0x0) {
    (*this->err_func->_vptr_ErrorFunc[2])();
  }
  if (this->err_func2 != (ErrorFunc2 *)0x0) {
    (*this->err_func2->_vptr_ErrorFunc2[2])();
  }
  pcVar1 = (this->derive_name)._M_dataplus._M_p;
  paVar2 = &(this->derive_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ErrorRec::~ErrorRec()
{
    delete err_func;
    delete err_func2;
}